

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>
          (SnapObject *snpObject,InflateMap *inflator)

{
  SnapArrayInfoBlock<double> *pSVar1;
  SnapArrayInfo<double> *pSVar2;
  ScriptContext *this;
  JavascriptLibrary *pJVar3;
  JavascriptArray *this_00;
  SnapObject *local_60;
  SnapObject *local_58;
  DynamicObject *rcObj;
  uint32 preAllocSpace;
  JavascriptLibrary *jslib;
  ScriptContext *ctx;
  SnapArrayInfoBlock<double> *dataBlock;
  SnapArrayInfo<double> *arrayInfo;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayInfo<double>*,(TTD::NSSnapObjects::SnapObjectType)21>
                     (snpObject);
  pSVar1 = pSVar2->Data;
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pJVar3 = Js::ScriptContext::GetLibrary(this);
  rcObj._4_4_ = 0;
  if ((((pSVar1 != (SnapArrayInfoBlock<double> *)0x0) &&
       (pSVar1->Next == (SnapArrayInfoBlock<double> *)0x0)) && (pSVar1->FirstIndex == 0)) &&
     (pSVar1->LastIndex < 0x101)) {
    rcObj._4_4_ = pSVar1->LastIndex;
  }
  if (snpObject->SnapType->JsTypeId == TypeIds_Array) {
    if (rcObj._4_4_ == 0) {
      snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateArray(pJVar3);
    }
    else {
      snpObject_local = (SnapObject *)ReuseObjectCheckAndReset(snpObject,inflator);
      if (snpObject_local == (SnapObject *)0x0) {
        snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateArray(pJVar3,rcObj._4_4_);
      }
      else {
        this_00 = Js::VarTo<Js::JavascriptArray,Js::DynamicObject>((DynamicObject *)snpObject_local)
        ;
        Js::JavascriptArray::SetLength(this_00,rcObj._4_4_);
      }
    }
  }
  else if (snpObject->SnapType->JsTypeId == TypeIds_NativeIntArray) {
    if (rcObj._4_4_ == 0) {
      pJVar3 = Js::ScriptContext::GetLibrary(this);
      local_58 = (SnapObject *)Js::JavascriptLibrary::CreateNativeIntArray(pJVar3);
    }
    else {
      pJVar3 = Js::ScriptContext::GetLibrary(this);
      local_58 = (SnapObject *)Js::JavascriptLibrary::CreateNativeIntArray(pJVar3,rcObj._4_4_);
    }
    snpObject_local = local_58;
  }
  else {
    if (snpObject->SnapType->JsTypeId != TypeIds_ArrayLast) {
      TTDAbort_unrecoverable_error("Unknown array type!");
    }
    if (rcObj._4_4_ == 0) {
      pJVar3 = Js::ScriptContext::GetLibrary(this);
      local_60 = (SnapObject *)Js::JavascriptLibrary::CreateNativeFloatArray(pJVar3);
    }
    else {
      pJVar3 = Js::ScriptContext::GetLibrary(this);
      local_60 = (SnapObject *)Js::JavascriptLibrary::CreateNativeFloatArray(pJVar3,rcObj._4_4_);
    }
    snpObject_local = local_60;
  }
  return (RecyclableObject *)snpObject_local;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapArrayInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Arrays can change type on us so seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed and add checks for same type-ness.

            const SnapArrayInfo<T>* arrayInfo = SnapObjectGetAddtlInfoAs<SnapArrayInfo<T>*, snapArrayKind>(snpObject);
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptLibrary* jslib = ctx->GetLibrary();
            uint32 preAllocSpace = 0;
            if(dataBlock != nullptr && dataBlock->Next == nullptr && dataBlock->FirstIndex == 0 && dataBlock->LastIndex <= TTD_ARRAY_SMALL_ARRAY)
            {
                preAllocSpace = dataBlock->LastIndex; //first index is 0
            }

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Array)
            {
                if(preAllocSpace == 0)
                {
                    return jslib->CreateArray();
                }
                else
                {
                    Js::DynamicObject* rcObj = ReuseObjectCheckAndReset(snpObject, inflator);
                    if(rcObj != nullptr)
                    {
                        Js::VarTo<Js::JavascriptArray>(rcObj)->SetLength(preAllocSpace);
                        return rcObj;
                    }
                    else
                    {
                        return jslib->CreateArray(preAllocSpace);
                    }
                }
            }
            else if(snpObject->SnapType->JsTypeId == Js::TypeIds_NativeIntArray)
            {
                return (preAllocSpace > 0) ? ctx->GetLibrary()->CreateNativeIntArray(preAllocSpace) : ctx->GetLibrary()->CreateNativeIntArray();
            }
            else if(snpObject->SnapType->JsTypeId == Js::TypeIds_NativeFloatArray)
            {
                return (preAllocSpace > 0) ? ctx->GetLibrary()->CreateNativeFloatArray(preAllocSpace) : ctx->GetLibrary()->CreateNativeFloatArray();
            }
            else
            {
                TTDAssert(false, "Unknown array type!");
                return nullptr;
            }
        }